

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O0

void __thiscall
sisl::cartesian_cubic<short>::each_site
          (cartesian_cubic<short> *this,
          function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *func,bool parallel)

{
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_60;
  int local_3c;
  undefined1 local_38 [8];
  lattice_site site;
  int k;
  int j;
  int i;
  bool parallel_local;
  function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *func_local;
  cartesian_cubic<short> *this_local;
  
  j._3_1_ = parallel;
  _i = func;
  func_local = (function<void_(const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_&)> *)this;
  for (k = 0; (uint)k <= this->_nx; k = k + 1) {
    for (site.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0
        ; site.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ <=
          this->_ny;
        site.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
             site.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
             + 1) {
      for (site.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
                0; (uint)site.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows <= this->_nz;
          site.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
               (uint)site.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows + 1) {
        local_3c = 3;
        Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>
                  ((Matrix<int,__1,_1,_0,__1,_1> *)local_38,&local_3c);
        Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator<<
                  (&local_60,(DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_38,&k);
        this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                            (&local_60,
                             (Scalar *)
                             ((long)&site.
                                     super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows + 4));
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_
                  (this_00,(Scalar *)
                           &site.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows);
        Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_60);
        std::function<void_(const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_&)>::operator()
                  (_i,(Matrix<int,__1,_1,_0,__1,_1> *)local_38);
        Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_38);
      }
    }
  }
  return;
}

Assistant:

virtual void each_site(const std::function<void(const lattice_site &)> &func, bool parallel = false) {
            #pragma omp parallel for if(parallel)
            for(int i = 0; i <= _nx; i++) {
                for(int j = 0; j <= _ny; j++) {
                    for(int k = 0; k <= _nz; k++) {
                        lattice_site site(3);
                        site << i, j, k;
                        func(site);
                    }
                }
            }
        }